

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_interp_enclosing_tri_in_list
          (REF_INTERP ref_interp,REF_LIST ref_list,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_INT cell_00;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rxs;
  uint unaff_R13D;
  long lVar2;
  double dVar3;
  REF_DBL current_bary [4];
  REF_INT nodes [27];
  int local_fc;
  double local_f8;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_interp->from_tri;
  ref_node = ref_interp->from_grid->node;
  if (ref_list->n < 1) {
    local_fc = -1;
  }
  else {
    local_f8 = -999.0;
    local_fc = -1;
    lVar2 = 0;
    do {
      cell_00 = ref_list->value[lVar2];
      uVar1 = ref_cell_nodes(ref_cell,cell_00,local_a8);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x17f,"ref_interp_enclosing_tri_in_list",(ulong)uVar1,"cell");
        return uVar1;
      }
      local_b0 = 0;
      uVar1 = ref_node_bary3(ref_node,local_a8,xyz,&local_c8);
      if ((uVar1 & 0xfffffffb) != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x182,"ref_interp_enclosing_tri_in_list",(ulong)uVar1,"bary");
        unaff_R13D = uVar1;
      }
      if (uVar1 != 4) {
        if (uVar1 != 0) {
          return unaff_R13D;
        }
        dVar3 = local_c8;
        if (local_c0 <= local_c8) {
          dVar3 = local_c0;
        }
        if (local_b8 <= dVar3) {
          dVar3 = local_b8;
        }
        if ((local_fc == -1) || (local_f8 < dVar3)) {
          local_fc = cell_00;
          local_f8 = dVar3;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < ref_list->n);
  }
  if (local_fc == -1) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x18d,
           "ref_interp_enclosing_tri_in_list","failed to find cell");
    uVar1 = 1;
  }
  else {
    *cell = local_fc;
    uVar1 = ref_cell_nodes(ref_cell,local_fc,local_a8);
    if (uVar1 == 0) {
      bary[3] = 0.0;
      uVar1 = ref_node_bary3(ref_node,local_a8,xyz,bary);
      if (uVar1 == 0) {
        uVar1 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x192,"ref_interp_enclosing_tri_in_list",(ulong)uVar1,"bary");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",400,
             "ref_interp_enclosing_tri_in_list",(ulong)uVar1,"cell");
    }
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_enclosing_tri_in_list(
    REF_INTERP ref_interp, REF_LIST ref_list, REF_DBL *xyz, REF_INT *cell,
    REF_DBL *bary) {
  REF_CELL ref_cell = ref_interp_from_tri(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, candidate, best_candidate;
  REF_DBL current_bary[4];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_list_item(ref_list, item) {
    candidate = ref_list_value(ref_list, item);
    RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
    current_bary[3] = 0.0;
    status = ref_node_bary3(ref_node, nodes, xyz, current_bary);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */

      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find cell");

  *cell = best_candidate;
  RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
  bary[3] = 0.0;
  RSS(ref_node_bary3(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}